

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall chrono::fea::ChNodeFEAxyzDDD::VariablesQbSetSpeed(ChNodeFEAxyzDDD *this,double step)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ChVector<double> local_88;
  RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_> local_68;
  ChVectorRef *local_50;
  undefined8 local_48;
  long local_38;
  ChVectorRef local_30;
  
  ChNodeFEAxyzDD::VariablesQbSetSpeed(&this->super_ChNodeFEAxyzDD,step);
  auVar3 = *(undefined1 (*) [16])(this->DDD_dt).m_data;
  dVar1 = (this->DDD_dt).m_data[2];
  ChVariables::Get_qb(&local_30,*(ChVariables **)&(this->super_ChNodeFEAxyzDD).field_0x188);
  local_68._0_8_ =
       local_30.
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ._0_8_;
  local_68._8_8_ = 3;
  local_48 = 0;
  local_38 = local_30.
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
             ._8_8_;
  local_50 = &local_30;
  if (2 < (long)local_30.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ._8_8_) {
    ChVector<double>::
    ChVector<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>,_1,1,false>>
              (&local_88,
               (MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
                *)&local_68,(type *)0x0);
    if (&this->DDD_dt != &local_88) {
      (this->DDD_dt).m_data[0] = local_88.m_data[0];
      (this->DDD_dt).m_data[1] = local_88.m_data[1];
      (this->DDD_dt).m_data[2] = local_88.m_data[2];
    }
    if ((step != 0.0) || (NAN(step))) {
      auVar3 = vsubpd_avx(*(undefined1 (*) [16])(this->DDD_dt).m_data,auVar3);
      dVar4 = 1.0 / step;
      dVar2 = (this->DDD_dt).m_data[2];
      (this->DDD_dtdt).m_data[0] = dVar4 * auVar3._0_8_;
      (this->DDD_dtdt).m_data[1] = dVar4 * auVar3._8_8_;
      (this->DDD_dtdt).m_data[2] = dVar4 * (dVar2 - dVar1);
    }
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChNodeFEAxyzDDD::VariablesQbSetSpeed(double step) {
    ChNodeFEAxyzDD::VariablesQbSetSpeed(step);

    ChVector<> oldDDD_dt = DDD_dt;
    SetDDD_dt(variables_DDD->Get_qb().segment(0, 3));
    if (step) {
        SetDDD_dtdt((DDD_dt - oldDDD_dt) / step);
    }
}